

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_pcm_rb_init_ex(ma_format format,ma_uint32 channels,ma_uint32 subbufferSizeInFrames,
                           ma_uint32 subbufferCount,ma_uint32 subbufferStrideInFrames,
                           void *pOptionalPreallocatedBuffer,
                           ma_allocation_callbacks *pAllocationCallbacks,ma_pcm_rb *pRB)

{
  ma_uint32 mVar1;
  int iVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  ma_format in_EDI;
  undefined4 in_R8D;
  ma_allocation_callbacks *in_R9;
  ma_data_source_config dataSourceConfig;
  ma_result result;
  ma_uint32 bpf;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  ma_result mVar4;
  size_t subbufferSizeInBytes;
  
  if (pOptionalPreallocatedBuffer == (void *)0x0) {
    mVar4 = MA_INVALID_ARGS;
  }
  else {
    subbufferSizeInBytes = 0x98;
    if (pOptionalPreallocatedBuffer != (void *)0x0) {
      memset(pOptionalPreallocatedBuffer,0,0x98);
    }
    iVar3 = in_ESI;
    mVar1 = ma_get_bytes_per_sample(in_EDI);
    iVar2 = mVar1 * in_ESI;
    if (iVar2 == 0) {
      mVar4 = MA_INVALID_ARGS;
    }
    else {
      mVar4 = ma_rb_init_ex(subbufferSizeInBytes,CONCAT44(in_stack_ffffffffffffffe4,in_EDI),
                            CONCAT44(iVar3,in_EDX),(void *)CONCAT44(in_ECX,in_R8D),in_R9,
                            (ma_rb *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
      if (mVar4 == MA_SUCCESS) {
        *(ma_format *)((long)pOptionalPreallocatedBuffer + 0x88) = in_EDI;
        *(int *)((long)pOptionalPreallocatedBuffer + 0x8c) = iVar3;
        *(undefined4 *)((long)pOptionalPreallocatedBuffer + 0x90) = 0;
        ma_data_source_config_init();
        mVar4 = ma_data_source_init((ma_data_source_config *)in_R9,
                                    (ma_data_source *)CONCAT44(iVar2,mVar4));
        if (mVar4 == MA_SUCCESS) {
          mVar4 = MA_SUCCESS;
        }
        else {
          ma_rb_uninit((ma_rb *)0x1dab5d);
        }
      }
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_pcm_rb_init_ex(ma_format format, ma_uint32 channels, ma_uint32 subbufferSizeInFrames, ma_uint32 subbufferCount, ma_uint32 subbufferStrideInFrames, void* pOptionalPreallocatedBuffer, const ma_allocation_callbacks* pAllocationCallbacks, ma_pcm_rb* pRB)
{
    ma_uint32 bpf;
    ma_result result;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pRB);

    bpf = ma_get_bytes_per_frame(format, channels);
    if (bpf == 0) {
        return MA_INVALID_ARGS;
    }

    result = ma_rb_init_ex(subbufferSizeInFrames*bpf, subbufferCount, subbufferStrideInFrames*bpf, pOptionalPreallocatedBuffer, pAllocationCallbacks, &pRB->rb);
    if (result != MA_SUCCESS) {
        return result;
    }

    pRB->format     = format;
    pRB->channels   = channels;
    pRB->sampleRate = 0;    /* The sample rate is not passed in as a parameter. */

    /* The PCM ring buffer is a data source. We need to get that set up as well. */
    {
        ma_data_source_config dataSourceConfig = ma_data_source_config_init();
        dataSourceConfig.vtable = &ma_gRBDataSourceVTable;

        result = ma_data_source_init(&dataSourceConfig, &pRB->ds);
        if (result != MA_SUCCESS) {
            ma_rb_uninit(&pRB->rb);
            return result;
        }
    }

    return MA_SUCCESS;
}